

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 07_result.cc
# Opt level: O2

result<std::string,_std::string> *
v2::divide(result<std::string,_std::string> *__return_storage_ptr__,string *s1,string *s2)

{
  ostream *poVar1;
  variant_alternative_t<1UL,_variant<int,_basic_string<char>_>_> *pvVar2;
  variant_alternative_t<0UL,_variant<int,_basic_string<char>_>_> *pvVar3;
  to_string_fn *in_RCX;
  result<int,_ErrorMsg> a;
  return_type c;
  result<int,_ErrorMsg> b;
  variant_alternative_t<0UL,_variant<int,_basic_string<char>_>_> local_bc;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)s1);
  poVar1 = std::operator<<(poVar1," / ");
  poVar1 = std::operator<<(poVar1,(string *)s2);
  std::operator<<(poVar1," = ?\n");
  to_int((result<int,_ErrorMsg> *)&local_b8,s1);
  to_int((result<int,_ErrorMsg> *)&local_68,s2);
  if (local_b8._M_index == '\0') {
    pvVar3 = ezy::features::result_adapter<std::variant<int,std::__cxx11::string>>::
             get_success<std::variant<int,std::__cxx11::string>const&>
                       ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_b8);
    local_bc = *pvVar3;
    in_RCX = (to_string_fn *)&local_bc;
    local_40._0_8_ = in_RCX;
    ezy::features::result_interface<ezy::features::result_adapter>::
    impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::visitable,ezy::features::result_like_continuation>>
    ::_impl::
    map<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::visitable,ezy::features::result_like_continuation>,ezy::features::result_adapter<std::variant<int,std::__cxx11::string>>,ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::visitable,ezy::features::result_like_continuation>const&,ezy::experimental::curried_with_args<std::divides<void>,int&>>
              ((strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::visitable,_ezy::features::result_like_continuation>
                *)&local_90,(_impl *)&local_68,
               (strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::visitable,_ezy::features::result_like_continuation>
                *)&local_40._M_first,(curried_with_args<std::divides<void>,_int_&> *)in_RCX);
  }
  else {
    pvVar2 = ezy::features::result_adapter<std::variant<int,std::__cxx11::string>>::
             get_error<std::variant<int,std::__cxx11::string>const&>
                       ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_b8);
    std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
    _Variant_storage<1ul,std::__cxx11::string_const&>
              ((_Variant_storage<false,int,std::__cxx11::string> *)&local_40,pvVar2);
    std::__detail::__variant::
    _Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Move_ctor_base((_Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_90,
                      (_Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_40._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage((_Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_40._M_first);
  }
  ezy::features::result_interface<ezy::features::result_adapter>::
  impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::visitable,ezy::features::result_like_continuation>>
  ::_impl::
  map<ezy::strong_type<std::variant<std::__cxx11::string,std::__cxx11::string>,void,ezy::features::visitable,ezy::features::result_like_continuation>,ezy::features::result_adapter<std::variant<std::__cxx11::string,std::__cxx11::string>>,ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::visitable,ezy::features::result_like_continuation>const&,ezy::to_string_fn_const&>
            (__return_storage_ptr__,(_impl *)&local_90,
             (strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::visitable,_ezy::features::result_like_continuation>
              *)&ezy::cpo::to_string,in_RCX);
  std::__detail::__variant::
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage(&local_90);
  std::__detail::__variant::
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage(&local_68);
  std::__detail::__variant::
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

ezy::result<std::string, std::string>
  divide(const std::string& s1, const std::string& s2)
  {
    std::cout << s1 << " / " << s2 << " = ?\n";
    const auto a = to_int(s1);
    const auto b = to_int(s2);

    static constexpr auto div = ezy::experimental::curry(std::divides<>{});

    const auto c = a.and_then(
        [&b](auto x) {
          return b.map(div(x));
        }
        );

    return c.map(ezy::to_string);
  }